

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

array_validator __thiscall goodform::sub_form::array(sub_form *this)

{
  bool bVar1;
  vector<std::any,_std::allocator<std::any>_> *value;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  sub_form *local_20;
  sub_form *this_local;
  
  local_20 = this;
  bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(this->variant_);
  if (bVar1) {
    value = get<std::vector<std::any,std::allocator<std::any>>>(this->variant_);
    array_validator::array_validator((array_validator *)&this_local,value,this->error_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"NOT AN ARRAY",&local_61)
    ;
    error_message::error_message(&local_40,&local_60);
    error_message::operator=(this->error_,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    array_validator::array_validator
              ((array_validator *)&this_local,
               (vector<std::any,_std::allocator<std::any>_> *)const_array,this->error_);
  }
  return _this_local;
}

Assistant:

array_validator sub_form::array()
  {

    if (!is<goodform::array_t>(this->variant_))
    {
      this->error_ = error_message("NOT AN ARRAY");
      return array_validator(const_array, this->error_);
    }
    else
    {
      return array_validator(get<goodform::array_t>(this->variant_), this->error_);
    }
  }